

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlphaVectorWeighted.cpp
# Opt level: O1

void __thiscall
AlphaVectorWeighted::AlphaVectorWeighted
          (AlphaVectorWeighted *this,shared_ptr<const_PlanningUnitDecPOMDPDiscrete> *pu,
          double weight)

{
  size_t __n;
  PlanningUnitMADPDiscrete *this_00;
  allocator_type local_49 [9];
  undefined8 *local_40;
  double local_38;
  
  local_38 = weight;
  AlphaVectorPlanning::AlphaVectorPlanning
            ((AlphaVectorPlanning *)&(this->super_AlphaVectorPOMDP).field_0x58,pu);
  AlphaVectorPOMDP::AlphaVectorPOMDP
            (&this->super_AlphaVectorPOMDP,&PTR_construction_vtable_24__005ac078,pu);
  AlphaVectorBG::AlphaVectorBG
            ((AlphaVectorBG *)&(this->super_AlphaVectorPOMDP).field_0x8,
             &PTR_construction_vtable_24__005ac088,pu);
  (this->super_AlphaVectorPOMDP)._vptr_AlphaVectorPOMDP =
       (_func_int **)&PTR__AlphaVectorWeighted_005ac010;
  *(undefined ***)&(this->super_AlphaVectorPOMDP).field_0x58 = &PTR__AlphaVectorWeighted_005ac060;
  *(undefined ***)&(this->super_AlphaVectorPOMDP).field_0x8 = &PTR__AlphaVectorWeighted_005ac038;
  this_00 = *(PlanningUnitMADPDiscrete **)&(this->super_AlphaVectorPOMDP).field_0x68;
  if (this_00 == (PlanningUnitMADPDiscrete *)0x0) {
    this_00 = *(PlanningUnitMADPDiscrete **)&(this->super_AlphaVectorPOMDP).field_0x70;
  }
  __n = PlanningUnitMADPDiscrete::GetNrStates(this_00);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&(this->super_AlphaVectorPOMDP).field_0x28,
             __n,&local_38,local_49);
  *(undefined8 *)&(this->super_AlphaVectorPOMDP).field_0x40 = 0;
  *(undefined8 *)&(this->super_AlphaVectorPOMDP).field_0x48 = 0;
  *(undefined8 *)&(this->super_AlphaVectorPOMDP).field_0x50 = 0;
  if ((0.0 <= local_38) && (local_38 <= 1.0)) {
    BackProjectWeights(this);
    return;
  }
  local_40 = (undefined8 *)__cxa_allocate_exception(0x28);
  *local_40 = &PTR__E_0059bd80;
  local_40[1] = local_40 + 3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(local_40 + 1),"AlphaVectorWeighted ctor: weight should be >=0 and <=1","");
  __cxa_throw(local_40,&E::typeinfo,E::~E);
}

Assistant:

AlphaVectorWeighted::
AlphaVectorWeighted(const boost::shared_ptr<const PlanningUnitDecPOMDPDiscrete> &pu,
                    double weight) :
    AlphaVectorPlanning(pu),
    AlphaVectorPOMDP(pu),
    AlphaVectorBG(pu),
    _m_weights(GetPU()->GetNrStates(),weight)
{
    if(weight < 0 || weight > 1)
        throw(E("AlphaVectorWeighted ctor: weight should be >=0 and <=1"));
    BackProjectWeights();
}